

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O2

bool adiak::value<std::__cxx11::string>
               (string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,int category
               ,string *subcategory)

{
  int iVar1;
  adiak_datatype_t *type;
  adiak_value_t *v;
  bool bVar2;
  
  type = internal::
         parse<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
         make_type();
  if (type == (adiak_datatype_t *)0x0) {
    bVar2 = false;
  }
  else {
    v = (adiak_value_t *)malloc(8);
    internal::
    element_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set(v,value);
    iVar1 = adiak_raw_namevalue((name->_M_dataplus)._M_p,category,(subcategory->_M_dataplus)._M_p,v,
                                type);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }